

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

Expression *
slang::ast::bindCovergroupExpr
          (ExpressionSyntax *syntax,ASTContext *context,Type *lvalueType,
          bitmask<slang::ast::ASTFlags> extraFlags)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_RCX;
  long in_RDX;
  sockaddr *in_RSI;
  int in_EDI;
  ASTContext *in_stack_00000010;
  ExpressionSyntax *in_stack_00000018;
  Type *in_stack_00000020;
  bitmask<slang::ast::ASTFlags> in_stack_00000028;
  SourceRange in_stack_00000030;
  Expression *expr;
  Expression *in_stack_00000308;
  ASTContext *in_stack_00000310;
  bitmask<slang::ast::EvalFlags> in_stack_0000031f;
  SourceRange *in_stack_ffffffffffffff70;
  bitmask<slang::ast::EvalFlags> local_71 [49];
  undefined8 local_40;
  Expression *local_28;
  undefined8 local_8;
  
  if (in_RDX == 0) {
    iVar1 = Expression::bind(in_EDI,in_RSI,(socklen_t)in_RCX);
    local_28 = (Expression *)CONCAT44(extraout_var,iVar1);
  }
  else {
    local_8 = in_RCX;
    SourceRange::SourceRange(in_stack_ffffffffffffff70);
    local_40 = local_8;
    local_28 = Expression::bindRValue
                         (in_stack_00000020,in_stack_00000018,in_stack_00000030,in_stack_00000010,
                          in_stack_00000028);
  }
  bitmask<slang::ast::EvalFlags>::bitmask(local_71,CovergroupExpr);
  ASTContext::eval(in_stack_00000310,in_stack_00000308,in_stack_0000031f);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x41018a);
  return local_28;
}

Assistant:

static const Expression& bindCovergroupExpr(const ExpressionSyntax& syntax,
                                            const ASTContext& context,
                                            const Type* lvalueType = nullptr,
                                            bitmask<ASTFlags> extraFlags = {}) {
    const Expression* expr;
    if (lvalueType)
        expr = &Expression::bindRValue(*lvalueType, syntax, {}, context, extraFlags);
    else
        expr = &Expression::bind(syntax, context, extraFlags);

    context.eval(*expr, EvalFlags::CovergroupExpr);
    return *expr;
}